

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

size_t ZSTD_hashPtr(void *p,U32 hBits,U32 mls)

{
  void *p_00;
  int in_EDX;
  U32 in_stack_ffffffffffffffdc;
  size_t local_8;
  
  p_00 = (void *)(ulong)(in_EDX - 4);
  switch(p_00) {
  default:
    local_8 = ZSTD_hash4Ptr(p_00,in_stack_ffffffffffffffdc);
    break;
  case (void *)0x1:
    local_8 = ZSTD_hash5Ptr(p_00,in_stack_ffffffffffffffdc);
    break;
  case (void *)0x2:
    local_8 = ZSTD_hash6Ptr(p_00,in_stack_ffffffffffffffdc);
    break;
  case (void *)0x3:
    local_8 = ZSTD_hash7Ptr(p_00,in_stack_ffffffffffffffdc);
    break;
  case (void *)0x4:
    local_8 = ZSTD_hash8Ptr(p_00,in_stack_ffffffffffffffdc);
  }
  return local_8;
}

Assistant:

MEM_STATIC size_t ZSTD_hashPtr(const void* p, U32 hBits, U32 mls)
{
    switch(mls)
    {
    default:
    case 4: return ZSTD_hash4Ptr(p, hBits);
    case 5: return ZSTD_hash5Ptr(p, hBits);
    case 6: return ZSTD_hash6Ptr(p, hBits);
    case 7: return ZSTD_hash7Ptr(p, hBits);
    case 8: return ZSTD_hash8Ptr(p, hBits);
    }
}